

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

bool __thiscall Clasp::Solver::pushRoot(Solver *this,Literal x)

{
  bool bVar1;
  ValueRep VVar2;
  uint32 v;
  uint32 uVar3;
  uint32 in_ESI;
  Solver *in_RDI;
  bool in_stack_0000000f;
  LitVec *in_stack_00000010;
  undefined4 in_stack_00000024;
  Solver *in_stack_00000028;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe8;
  uint32 in_stack_ffffffffffffffec;
  Solver *this_00;
  Literal local_8;
  bool local_1;
  
  this_00 = in_RDI;
  local_8.rep_ = in_ESI;
  bVar1 = hasConflict((Solver *)0x1e89cc);
  if (bVar1) {
    local_1 = false;
  }
  else {
    v = decisionLevel((Solver *)0x1e89e6);
    uVar3 = rootLevel(in_RDI);
    if (v != uVar3) {
      popRootLevel((Solver *)CONCAT44(in_stack_00000024,x.rep_),this._4_4_,in_stack_00000010,
                   in_stack_0000000f);
    }
    uVar3 = queueSize((Solver *)0x1e8a1d);
    if ((uVar3 != 0) && (bVar1 = propagate((Solver *)CONCAT44(v,in_stack_ffffffffffffffd8)), !bVar1)
       ) {
      return false;
    }
    Literal::var(&local_8);
    VVar2 = value(in_RDI,v);
    if (VVar2 == '\0') {
      assume(in_stack_00000028,(Literal *)CONCAT44(in_stack_00000024,x.rep_));
      (in_RDI->stats).super_CoreStats.choices = (in_RDI->stats).super_CoreStats.choices - 1;
      pushRootLevel(this_00,in_stack_ffffffffffffffec);
      local_1 = propagate((Solver *)CONCAT44(v,in_stack_ffffffffffffffd8));
    }
    else {
      local_1 = isTrue((Solver *)CONCAT44(local_8.rep_,in_stack_ffffffffffffffe8),
                       (Literal)(uint32)((ulong)this_00 >> 0x20));
    }
  }
  return local_1;
}

Assistant:

bool Solver::pushRoot(Literal x) {
	if (hasConflict())                 { return false; }
	if (decisionLevel()!= rootLevel()) { popRootLevel(0);  }
	if (queueSize() && !propagate())   { return false;    }
	if (value(x.var()) != value_free)  { return isTrue(x);}
	assume(x); --stats.choices;
	pushRootLevel();
	return propagate();
}